

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

int phits_tryload_reclen(phits_fileinternal_t *f,int reclen)

{
  int iVar1;
  ulong *puVar2;
  ulong uVar3;
  int in_ESI;
  long in_RDI;
  uint64_t l2;
  uint64_t tmp;
  uint64_t l1;
  char *buf;
  undefined8 local_48;
  undefined8 in_stack_ffffffffffffffc0;
  ulong uVar4;
  phits_fileinternal_t *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  iVar1 = phits_ensure_load(in_stack_ffffffffffffffc8,
                            (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    puVar2 = (ulong *)(in_RDI + 0x90);
    if (in_ESI == 4) {
      uVar3 = (ulong)*(uint *)puVar2;
    }
    else {
      uVar3 = *puVar2;
    }
    uVar4 = uVar3;
    if (0x7fffffff < uVar3 + (long)(in_ESI << 1)) {
      phits_error((char *)0x1028f6);
    }
    iVar1 = phits_ensure_load(in_stack_ffffffffffffffc8,(int)(uVar4 >> 0x20));
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      puVar2 = (ulong *)((long)in_ESI + uVar3 + (long)puVar2);
      if (in_ESI == 4) {
        local_48 = (ulong)(uint)*puVar2;
      }
      else {
        local_48 = *puVar2;
      }
      if (uVar3 == local_48) {
        *(int *)(in_RDI + 0x88) = in_ESI;
        if ((uVar3 != 0x50) && (uVar3 != 0x68)) {
          phits_error((char *)0x102997);
        }
        *(int *)(in_RDI + 0x8c) = (int)uVar3;
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int phits_tryload_reclen(phits_fileinternal_t* f, int reclen ) {
  assert(reclen==4||reclen==8);
  if ( ! phits_ensure_load( f, reclen ) )
    return 0;
  char * buf = & ( f->buf[0] );
  uint64_t l1 = ( reclen == 4 ? (uint64_t)(*((uint32_t*)buf)) : (uint64_t)(*((uint64_t*)buf)) );
  uint64_t tmp = l1 + 2*reclen;
  if ( tmp > INT_MAX )
    phits_error("Unexpectedly large record encountered");
  if ( ! phits_ensure_load( f, (int)tmp ) )
    return 0;
  buf += (reclen + l1);
  uint64_t l2 = ( reclen == 4 ? (uint64_t)(*((uint32_t*)buf)) : (uint64_t)(*((uint64_t*)buf)) );
  if (l1!=l2)
    return 0;
  //All ok!
  f->reclen = reclen;
  if ( l1 != 10*8 && l1 != 13*8 )
    phits_error("Unexpected particle size!");
  f->particlesize = (unsigned)l1;
  return 1;
}